

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int serial_open(char *dev,uint baud,uint flags)

{
  int iVar1;
  size_t sVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  char *in_RDI;
  gpioExtent_t ext [1];
  int len;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  sVar2 = strlen(in_RDI);
  iVar1 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                             (int)sVar2 >> 0x1f,(gpioExtent_t *)CONCAT44(in_ESI,in_EDX),(int)in_RDI)
  ;
  return iVar1;
}

Assistant:

int serial_open(char *dev, unsigned baud, unsigned flags)
{
   int len;
   gpioExtent_t ext[1];

   len = strlen(dev);

   /*
   p1=baud
   p2=flags
   p3=len
   ## extension ##
   char dev[len]
   */

   ext[0].size = len;
   ext[0].ptr = dev;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_SERO, baud, flags, len, 1, ext, 1);
}